

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.hpp
# Opt level: O0

die_object __thiscall
cpptrace::detail::libdwarf::die_object::resolve_reference_attribute
          (die_object *this,Dwarf_Half attr_num)

{
  source_location location;
  source_location location_00;
  source_location location_01;
  source_location location_02;
  source_location location_03;
  source_location location_04;
  source_location location_05;
  source_location location_06;
  source_location location_07;
  int iVar1;
  uint uVar2;
  int iVar3;
  Dwarf_Half in_DX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  Dwarf_Die extraout_RDX;
  undefined6 in_register_00000032;
  die_object *this_00;
  die_object dVar4;
  source_location location_08;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  undefined4 in_stack_fffffffffffffdb0;
  uint uVar5;
  undefined4 in_stack_fffffffffffffdb4;
  string local_1e0;
  string local_1c0;
  source_location local_1a0;
  source_location local_190;
  int *local_180;
  Dwarf_Die_s **local_178;
  Dwarf_Sig8_s *local_170;
  int local_164;
  Dwarf_Die pDStack_160;
  Dwarf_Bool targ_is_info;
  Dwarf_Die target_2;
  Dwarf_Sig8_s *local_148;
  Dwarf_Sig8_s local_140;
  Dwarf_Sig8 signature;
  Dwarf_Die_s **local_128;
  Dwarf_Die_s *local_120;
  Dwarf_Die target_1;
  undefined1 auStack_110 [4];
  int is_info_1;
  unsigned_long_long *local_100;
  unsigned_long_long local_f8;
  Dwarf_Off off_1;
  source_location local_e8;
  Dwarf_Die_s **local_d8;
  Dwarf_Die_s *local_d0;
  Dwarf_Die target;
  unsigned_long_long *local_b8;
  unsigned_long_long local_b0;
  Dwarf_Off global_offset;
  Dwarf_Bool *local_98;
  unsigned_long_long *local_90;
  Dwarf_Bool local_84;
  unsigned_long_long uStack_80;
  Dwarf_Bool is_info;
  Dwarf_Off off;
  unsigned_short *local_58;
  unsigned_short local_4c [2];
  undefined1 local_48 [4];
  Dwarf_Half form;
  raii_wrapper<Dwarf_Attribute_s_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O0__deps_cpptrace_src_src_symbols_dwarf_dwarf_hpp:202:44),_0,_0,_0>
  wrapper;
  Dwarf_Attribute local_28;
  Dwarf_Attribute attr;
  die_object *pdStack_18;
  Dwarf_Half attr_num_local;
  die_object *this_local;
  
  this_00 = (die_object *)CONCAT62(in_register_00000032,attr_num);
  pdStack_18 = this_00;
  this_local = this;
  iVar1 = dwarf_attr(this_00->die,in_DX,&local_28,(Dwarf_Error *)0x0);
  source_location::source_location
            ((source_location *)&wrapper.deleter,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
             ,0xc9);
  location.file._4_4_ = in_stack_fffffffffffffdac;
  location.file._0_4_ = in_stack_fffffffffffffda8;
  location.line = in_stack_fffffffffffffdb0;
  location._12_4_ = in_stack_fffffffffffffdb4;
  assert_impl<bool>((detail *)(ulong)(iVar1 == 0),true,0x33f242,
                    "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                    ,(char *)wrapper._8_8_,location);
  raii_wrap<Dwarf_Attribute_s_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O0__deps_cpptrace_src_src_symbols_dwarf_dwarf_hpp:202:44),_0,_0>
            (local_48,local_28);
  local_4c[0] = 0;
  local_58 = local_4c;
  iVar1 = wrap<Dwarf_Attribute_s_*,_unsigned_short_*,_Dwarf_Error_s_**,_Dwarf_Attribute_s_*&,_unsigned_short_*,_0>
                    (this_00,dwarf_whatform,&local_28,&local_58);
  source_location::source_location
            ((source_location *)&off,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
             ,0xcc);
  location_00.file._4_4_ = in_stack_fffffffffffffdac;
  location_00.file._0_4_ = in_stack_fffffffffffffda8;
  location_00.line = in_stack_fffffffffffffdb0;
  location_00._12_4_ = in_stack_fffffffffffffdb4;
  assert_impl<bool>((detail *)(ulong)(iVar1 == 0),true,0x33d580,
                    "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                    ,(char *)off,location_00);
  uVar2 = (uint)local_4c[0];
  if (uVar2 == 0x10) {
    local_100 = &local_f8;
    iVar1 = wrap<Dwarf_Attribute_s_*,_unsigned_long_long_*,_Dwarf_Error_s_**,_Dwarf_Attribute_s_*&,_unsigned_long_long_*,_0>
                      (this_00,dwarf_global_formref,&local_28,&local_100);
    source_location::source_location
              ((source_location *)auStack_110,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
               ,0xe0);
    location_04.file._4_4_ = in_stack_fffffffffffffdac;
    location_04.file._0_4_ = in_stack_fffffffffffffda8;
    location_04.line = in_stack_fffffffffffffdb0;
    location_04._12_4_ = in_stack_fffffffffffffdb4;
    assert_impl<bool>((detail *)(ulong)(iVar1 == 0),true,0x33d741,
                      "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                      ,_auStack_110,location_04);
    target_1._4_4_ = dwarf_get_die_infotypes_flag(this_00->die);
    local_120 = (Dwarf_Die)0x0;
    local_128 = &local_120;
    iVar1 = wrap<Dwarf_Debug_s_*,_unsigned_long_long,_int,_Dwarf_Die_s_**,_Dwarf_Error_s_**,_Dwarf_Debug_s_*const_&,_unsigned_long_long_&,_int_&,_Dwarf_Die_s_**,_0>
                      (this_00,dwarf_offdie_b,(Dwarf_Debug_s **)this_00,&local_f8,
                       (int *)((long)&target_1 + 4),&local_128);
    source_location::source_location
              ((source_location *)&signature,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
               ,0xe3);
    location_05.file._4_4_ = in_stack_fffffffffffffdac;
    location_05.file._0_4_ = in_stack_fffffffffffffda8;
    location_05.line = in_stack_fffffffffffffdb0;
    location_05._12_4_ = in_stack_fffffffffffffdb4;
    assert_impl<bool>((detail *)(ulong)(iVar1 == 0),true,0x33f3a6,
                      "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                      ,(char *)signature.signature,location_05);
    die_object(this,this_00->dbg,local_120);
  }
  else if (uVar2 - 0x11 < 5) {
    uStack_80 = 0;
    local_84 = dwarf_get_die_infotypes_flag(this_00->die);
    local_90 = &stack0xffffffffffffff80;
    local_98 = &local_84;
    iVar1 = wrap<Dwarf_Attribute_s_*,_unsigned_long_long_*,_int_*,_Dwarf_Error_s_**,_Dwarf_Attribute_s_*&,_unsigned_long_long_*,_int_*,_0>
                      (this_00,dwarf_formref,&local_28,&local_90,&local_98);
    source_location::source_location
              ((source_location *)&global_offset,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
               ,0xd6);
    location_01.file._4_4_ = in_stack_fffffffffffffdac;
    location_01.file._0_4_ = in_stack_fffffffffffffda8;
    location_01.line = in_stack_fffffffffffffdb0;
    location_01._12_4_ = in_stack_fffffffffffffdb4;
    assert_impl<bool>((detail *)(ulong)(iVar1 == 0),true,0x33f2da,
                      "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                      ,(char *)global_offset,location_01);
    local_b0 = 0;
    local_b8 = &local_b0;
    iVar1 = wrap<Dwarf_Attribute_s_*,_unsigned_long_long,_unsigned_long_long_*,_Dwarf_Error_s_**,_Dwarf_Attribute_s_*&,_unsigned_long_long_&,_unsigned_long_long_*,_0>
                      (this_00,dwarf_convert_to_global_offset,&local_28,&stack0xffffffffffffff80,
                       &local_b8);
    source_location::source_location
              ((source_location *)&target,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
               ,0xd8);
    location_02.file._4_4_ = in_stack_fffffffffffffdac;
    location_02.file._0_4_ = in_stack_fffffffffffffda8;
    location_02.line = in_stack_fffffffffffffdb0;
    location_02._12_4_ = in_stack_fffffffffffffdb4;
    assert_impl<bool>((detail *)(ulong)(iVar1 == 0),true,0x33f311,
                      "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                      ,(char *)target,location_02);
    local_d0 = (Dwarf_Die)0x0;
    local_d8 = &local_d0;
    iVar1 = wrap<Dwarf_Debug_s_*,_unsigned_long_long,_int,_Dwarf_Die_s_**,_Dwarf_Error_s_**,_Dwarf_Debug_s_*const_&,_unsigned_long_long_&,_int_&,_Dwarf_Die_s_**,_0>
                      (this_00,dwarf_offdie_b,(Dwarf_Debug_s **)this_00,&local_b0,&local_84,
                       &local_d8);
    source_location::source_location
              (&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
               ,0xda);
    location_03.file._4_4_ = in_stack_fffffffffffffdac;
    location_03.file._0_4_ = in_stack_fffffffffffffda8;
    location_03.line = in_stack_fffffffffffffdb0;
    location_03._12_4_ = in_stack_fffffffffffffdb4;
    assert_impl<bool>((detail *)(ulong)(iVar1 == 0),true,0x33f35e,
                      "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                      ,local_e8.file,location_03);
    die_object(this,this_00->dbg,local_d0);
  }
  else {
    if (uVar2 != 0x20) {
      source_location::source_location
                (&local_1a0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                 ,0xf0);
      microfmt::format<unsigned_short&,unsigned_short&>
                (&local_1e0,(microfmt *)"unknown form for attribute {} {}\n",
                 (char *)((long)&attr + 6),local_4c,(unsigned_short *)off);
      as_string<std::__cxx11::string>(&local_1c0,(detail *)&local_1e0,value);
      location_08.file = (char *)(ulong)(uint)local_1a0.line;
      location_08._8_8_ = &local_1c0;
      panic((detail *)
            "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
            ,local_1a0.file,location_08,(string *)off);
    }
    local_148 = &local_140;
    iVar1 = wrap<Dwarf_Attribute_s_*,_Dwarf_Sig8_s_*,_Dwarf_Error_s_**,_Dwarf_Attribute_s_*&,_Dwarf_Sig8_s_*,_0>
                      (this_00,dwarf_formsig8,&local_28,&local_148);
    uVar5 = CONCAT13(iVar1 == 0,(int3)in_stack_fffffffffffffdb0);
    source_location::source_location
              ((source_location *)&target_2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
               ,0xe9);
    location_06.file._4_4_ = in_stack_fffffffffffffdac;
    location_06.file._0_4_ = in_stack_fffffffffffffda8;
    location_06.line = uVar5;
    location_06._12_4_ = iVar1;
    assert_impl<bool>((detail *)(ulong)(uVar5 >> 0x18 & 1),true,0x33f3e4,
                      "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                      ,(char *)target_2,location_06);
    pDStack_160 = (Dwarf_Die)0x0;
    local_164 = 0;
    local_170 = &local_140;
    local_178 = &stack0xfffffffffffffea0;
    local_180 = &local_164;
    iVar3 = wrap<Dwarf_Debug_s_*,_Dwarf_Sig8_s_*,_Dwarf_Die_s_**,_int_*,_Dwarf_Error_s_**,_Dwarf_Debug_s_*const_&,_Dwarf_Sig8_s_*,_Dwarf_Die_s_**,_int_*,_0>
                      (this_00,dwarf_find_die_given_sig8,(Dwarf_Debug_s **)this_00,&local_170,
                       &local_178,&local_180);
    uVar2 = CONCAT13(iVar3 == 0,(int3)in_stack_fffffffffffffda8);
    source_location::source_location
              (&local_190,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
               ,0xec);
    location_07.file._4_4_ = iVar3;
    location_07.file._0_4_ = uVar2;
    location_07.line = uVar5;
    location_07._12_4_ = iVar1;
    assert_impl<bool>((detail *)(ulong)(uVar2 >> 0x18 & 1),true,0x33f418,
                      "die_object cpptrace::detail::libdwarf::die_object::resolve_reference_attribute(Dwarf_Half) const"
                      ,local_190.file,location_07);
    die_object(this,this_00->dbg,pDStack_160);
  }
  off_1._4_4_ = 1;
  raii_wrapper<Dwarf_Attribute_s_*,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O0/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp:202:44),_0,_0,_0>
  ::~raii_wrapper((raii_wrapper<Dwarf_Attribute_s_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gnilk[P]testrunner_build_O0__deps_cpptrace_src_src_symbols_dwarf_dwarf_hpp:202:44),_0,_0,_0>
                   *)local_48);
  dVar4.die = extraout_RDX;
  dVar4.dbg = (Dwarf_Debug)this;
  return dVar4;
}

Assistant:

die_object resolve_reference_attribute(Dwarf_Half attr_num) const {
            Dwarf_Attribute attr;
            VERIFY(dwarf_attr(die, attr_num, &attr, nullptr) == DW_DLV_OK);
            auto wrapper = raii_wrap(attr, [] (Dwarf_Attribute attr) { dwarf_dealloc_attribute(attr); });
            Dwarf_Half form = 0;
            VERIFY(wrap(dwarf_whatform, attr, &form) == DW_DLV_OK);
            switch(form) {
                case DW_FORM_ref1:
                case DW_FORM_ref2:
                case DW_FORM_ref4:
                case DW_FORM_ref8:
                case DW_FORM_ref_udata:
                    {
                        Dwarf_Off off = 0;
                        Dwarf_Bool is_info = dwarf_get_die_infotypes_flag(die);
                        VERIFY(wrap(dwarf_formref, attr, &off, &is_info) == DW_DLV_OK);
                        Dwarf_Off global_offset = 0;
                        VERIFY(wrap(dwarf_convert_to_global_offset, attr, off, &global_offset) == DW_DLV_OK);
                        Dwarf_Die target = nullptr;
                        VERIFY(wrap(dwarf_offdie_b, dbg, global_offset, is_info, &target) == DW_DLV_OK);
                        return die_object(dbg, target);
                    }
                case DW_FORM_ref_addr:
                    {
                        Dwarf_Off off;
                        VERIFY(wrap(dwarf_global_formref, attr, &off) == DW_DLV_OK);
                        int is_info = dwarf_get_die_infotypes_flag(die);
                        Dwarf_Die target = nullptr;
                        VERIFY(wrap(dwarf_offdie_b, dbg, off, is_info, &target) == DW_DLV_OK);
                        return die_object(dbg, target);
                    }
                case DW_FORM_ref_sig8:
                    {
                        Dwarf_Sig8 signature;
                        VERIFY(wrap(dwarf_formsig8, attr, &signature) == DW_DLV_OK);
                        Dwarf_Die target = nullptr;
                        Dwarf_Bool targ_is_info = false;
                        VERIFY(wrap(dwarf_find_die_given_sig8, dbg, &signature, &target, &targ_is_info) == DW_DLV_OK);
                        return die_object(dbg, target);
                    }
                default:
                    PANIC(microfmt::format("unknown form for attribute {} {}\n", attr_num, form));
            }
        }